

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

String __thiscall testing::FormatCxxExceptionMessage(testing *this,char *description,char *location)

{
  Message *this_00;
  size_t extraout_RDX;
  String SVar1;
  Message *in_stack_ffffffffffffffa8;
  Message *in_stack_ffffffffffffffb0;
  Message local_28;
  Message message;
  char *location_local;
  char *description_local;
  
  message.ss_.ptr_ =
       (scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        )(scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )location;
  Message::Message(in_stack_ffffffffffffffb0);
  if (description == (char *)0x0) {
    Message::operator<<(&local_28,(char (*) [22])"Unknown C++ exception");
  }
  else {
    in_stack_ffffffffffffffb0 =
         Message::operator<<(&local_28,(char (*) [33])"C++ exception with description \"");
    in_stack_ffffffffffffffa8 =
         Message::operator<<(in_stack_ffffffffffffffb0,(char **)in_stack_ffffffffffffffa8);
    Message::operator<<(in_stack_ffffffffffffffa8,(char (*) [2])0x1632ca);
  }
  Message::operator<<(in_stack_ffffffffffffffb0,(char (*) [12])in_stack_ffffffffffffffa8);
  this_00 = Message::operator<<(in_stack_ffffffffffffffb0,(char **)in_stack_ffffffffffffffa8);
  Message::operator<<(this_00,(char (*) [2])0x1616e5);
  Message::GetString(in_stack_ffffffffffffffa8);
  Message::~Message((Message *)0x141f4a);
  SVar1.length_ = extraout_RDX;
  SVar1.c_str_ = (char *)this;
  return SVar1;
}

Assistant:

static internal::String FormatCxxExceptionMessage(const char* description,
                                                  const char* location) {
  Message message;
  if (description != NULL) {
    message << "C++ exception with description \"" << description << "\"";
  } else {
    message << "Unknown C++ exception";
  }
  message << " thrown in " << location << ".";

  return message.GetString();
}